

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_io.cc
# Opt level: O2

void __thiscall
gimage::JPEGImageIO::loadHeader(JPEGImageIO *this,char *name,long *width,long *height,int *depth)

{
  int iVar1;
  FILE *__stream;
  IOException *pIVar2;
  allocator local_3c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo;
  
  iVar1 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar1 == '\0') {
    pIVar2 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_3c8,name,&local_3c9);
    std::operator+(&local_3a8,"Can only load JPG image (",&local_3c8);
    std::operator+(&local_388,&local_3a8,")");
    gutil::IOException::IOException(pIVar2,&local_388);
    __cxa_throw(pIVar2,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __stream = fopen(name,"rb");
  if (__stream != (FILE *)0x0) {
    cinfo.err = (jpeg_error_mgr *)jpeg_std_error(&jerr);
    jpeg_CreateDecompress(&cinfo,0x50,0x290);
    jpeg_stdio_src(&cinfo,__stream);
    jpeg_read_header(&cinfo,1);
    *width = (ulong)cinfo.image_width;
    *height = (ulong)cinfo.image_height;
    *depth = cinfo.num_components;
    jpeg_destroy_decompress(&cinfo);
    fclose(__stream);
    return;
  }
  pIVar2 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_3c8,name,&local_3c9);
  std::operator+(&local_3a8,"Cannot open file for reading (",&local_3c8);
  std::operator+(&local_388,&local_3a8,")");
  gutil::IOException::IOException(pIVar2,&local_388);
  __cxa_throw(pIVar2,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void JPEGImageIO::loadHeader(const char *name, long &width, long &height,
                             int &depth) const
{
  struct jpeg_decompress_struct cinfo;
  struct jpeg_error_mgr jerr;
  FILE   *in=0;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load JPG image ("+std::string(name)+")");
  }

  // open output file using C methods

  in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file for reading ("+std::string(name)+")");
  }

  // installing standard error handler, create compression object and set output file

  cinfo.err=jpeg_std_error(&jerr);
  jpeg_create_decompress(&cinfo);
  jpeg_stdio_src(&cinfo, in);

  // read header information

  jpeg_read_header(&cinfo, TRUE);

  width=static_cast<long>(cinfo.image_width);
  height=static_cast<long>(cinfo.image_height);
  depth=cinfo.num_components;

  // close object and input stream

  jpeg_destroy_decompress(&cinfo);
  fclose(in);
}